

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O2

void XPMP2::RemoteCleanup(void)

{
  void *in_RSI;
  
  RmtStopAll();
  if (gpMc != (long *)0x0) {
    (**(code **)(*gpMc + 8))();
    gpMc = (long *)0x0;
  }
  RmtMsgBufTy<XPMP2::RemoteAcDetailTy,_(XPMP2::RemoteMsgTy)3,_(unsigned_char)'\x03'>::free
            ((RmtMsgBufTy<XPMP2::RemoteAcDetailTy,_(XPMP2::RemoteMsgTy)3,_(unsigned_char)__x03_> *)
             gMsgAcDetail,in_RSI);
  return;
}

Assistant:

void RemoteCleanup ()
{
    RmtStopAll();               // stop everything (multicast listening/sending, thread)
    if (gpMc) {                 // remove the multicast object
        delete gpMc;
        gpMc = nullptr;
    }
    
    // Remove all message caches
    gMsgAcDetail.free();
}